

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

const_iterator __thiscall
frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>::
find<frozen::basic_string<char>>
          (unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char> *key)

{
  const_iterator this_00;
  bool bVar1;
  size_t sVar2;
  
  this_00 = (const_iterator)(this + 0x48);
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<void>>::
          lookup<frozen::basic_string<char>,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)this_00,key,(elsa<void> *)this_00);
  if (sVar2 != 3) {
    bVar1 = eq::operator()((eq *)this,(string *)(this + sVar2 * 0x18),key);
    if (bVar1) {
      return (const_iterator)(this + sVar2 * 0x18);
    }
  }
  return this_00;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }